

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

char * glslang::TQualifier::getLayoutDepthString(TLayoutDepth d)

{
  if (d - EldAny < 4) {
    return &DAT_00729250 + *(int *)(&DAT_00729250 + (ulong)(d - EldAny) * 4);
  }
  return "none";
}

Assistant:

static const char* getLayoutDepthString(TLayoutDepth d)
    {
        switch (d) {
        case EldAny:       return "depth_any";
        case EldGreater:   return "depth_greater";
        case EldLess:      return "depth_less";
        case EldUnchanged: return "depth_unchanged";
        default:           return "none";
        }
    }